

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdPrint(FILE *pFile,Kit_DsdNtk_t *pNtk)

{
  int iVar1;
  
  fwrite("F = ",4,1,(FILE *)pFile);
  iVar1 = Abc_LitIsCompl((uint)pNtk->Root);
  if (iVar1 != 0) {
    fputc(0x21,(FILE *)pFile);
  }
  iVar1 = Abc_Lit2Var((uint)pNtk->Root);
  Kit_DsdPrint_rec(pFile,pNtk,iVar1);
  return;
}

Assistant:

void Kit_DsdPrint( FILE * pFile, Kit_DsdNtk_t * pNtk )
{
    fprintf( pFile, "F = " );
    if ( Abc_LitIsCompl(pNtk->Root) )
        fprintf( pFile, "!" );
    Kit_DsdPrint_rec( pFile, pNtk, Abc_Lit2Var(pNtk->Root) );
//    fprintf( pFile, "\n" );
}